

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_analysis.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DominatorAnalysisBase::Dominates
          (DominatorAnalysisBase *this,Instruction *a,Instruction *b)

{
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  BasicBlock *local_48;
  Instruction *other;
  Instruction *current;
  BasicBlock *bb_b;
  BasicBlock *bb_a;
  Instruction *b_local;
  Instruction *a_local;
  DominatorAnalysisBase *this_local;
  
  if ((a == (Instruction *)0x0) || (b == (Instruction *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (a == b) {
    this_local._7_1_ = true;
  }
  else {
    bb_a = (BasicBlock *)b;
    b_local = a;
    a_local = (Instruction *)this;
    pIVar3 = opt::Instruction::context(a);
    bb_b = IRContext::get_instr_block(pIVar3,b_local);
    pIVar3 = opt::Instruction::context((Instruction *)bb_a);
    current = (Instruction *)IRContext::get_instr_block(pIVar3,(Instruction *)bb_a);
    if (bb_b == (BasicBlock *)current) {
      other = b_local;
      local_48 = bb_a;
      bVar1 = DominatorTree::IsPostDominator(&this->tree_);
      if (bVar1) {
        std::swap<spvtools::opt::Instruction_const*>(&other,(Instruction **)&local_48);
      }
      OVar2 = opt::Instruction::opcode(other);
      if (OVar2 == OpLabel) {
        this_local._7_1_ = true;
      }
      else {
        do {
          other = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                            (&other->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
          if ((BasicBlock *)other == (BasicBlock *)0x0) {
            return false;
          }
        } while ((BasicBlock *)other != local_48);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = DominatorTree::Dominates(&this->tree_,bb_b,(BasicBlock *)current);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DominatorAnalysisBase::Dominates(Instruction* a, Instruction* b) const {
  if (!a || !b) {
    return false;
  }

  if (a == b) {
    return true;
  }

  BasicBlock* bb_a = a->context()->get_instr_block(a);
  BasicBlock* bb_b = b->context()->get_instr_block(b);

  if (bb_a != bb_b) {
    return tree_.Dominates(bb_a, bb_b);
  }

  const Instruction* current = a;
  const Instruction* other = b;

  if (tree_.IsPostDominator()) {
    std::swap(current, other);
  }

  // We handle OpLabel instructions explicitly since they are not stored in the
  // instruction list.
  if (current->opcode() == spv::Op::OpLabel) {
    return true;
  }

  while ((current = current->NextNode())) {
    if (current == other) {
      return true;
    }
  }

  return false;
}